

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Client * __thiscall
capnp::Orphan<capnp::DynamicCapability>::getReader
          (Client *__return_storage_ptr__,Orphan<capnp::DynamicCapability> *this)

{
  OrphanBuilder local_30;
  Orphan<capnp::DynamicCapability> *this_local;
  
  local_30.capTable = (CapTableBuilder *)(this->schema).super_Schema.raw;
  local_30.location = (word *)this;
  this_local = (Orphan<capnp::DynamicCapability> *)__return_storage_ptr__;
  _::OrphanBuilder::asCapability(&local_30);
  DynamicCapability::Client::Client
            (__return_storage_ptr__,(InterfaceSchema)local_30.capTable,
             (Own<capnp::ClientHook,_std::nullptr_t> *)&local_30);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

DynamicCapability::Client Orphan<DynamicCapability>::getReader() const {
  return DynamicCapability::Client(schema, builder.asCapability());
}